

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  uchar zerobyte [1];
  size_t size;
  uchar bytes [65];
  secp256k1_scalar zero;
  secp256k1_ge r;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_ge *in_stack_fffffffffffffa38;
  size_t *size_00;
  secp256k1_gej *in_stack_fffffffffffffa40;
  secp256k1_ge *in_stack_fffffffffffffa48;
  secp256k1_sha256 *hash;
  secp256k1_gej *in_stack_fffffffffffffa98;
  secp256k1_ge *in_stack_fffffffffffffaa0;
  secp256k1_scalar *in_stack_fffffffffffffb20;
  secp256k1_gej *in_stack_fffffffffffffb28;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffb30;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffb38;
  secp256k1_scalar *in_stack_fffffffffffffb40;
  secp256k1_gej *in_stack_fffffffffffffb48;
  secp256k1_scratch *in_stack_fffffffffffffb50;
  secp256k1_callback *in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb70;
  
  memset(&stack0xfffffffffffffaa0,0,0x20);
  hash = (secp256k1_sha256 *)0x41;
  secp256k1_gej_set_ge(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x143e5a);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  secp256k1_ecmult((secp256k1_gej *)rj5.z._40_8_,(secp256k1_gej *)rj5.z.n[4],
                   (secp256k1_scalar *)rj5.z.n[3],(secp256k1_scalar *)rj5.z.n[2]);
  secp256k1_ecmult((secp256k1_gej *)rj5.z._40_8_,(secp256k1_gej *)rj5.z.n[4],
                   (secp256k1_scalar *)rj5.z.n[3],(secp256k1_scalar *)rj5.z.n[2]);
  secp256k1_ecmult_multi_var
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb70);
  size_00 = (size_t *)0x1;
  secp256k1_ecmult_multi_var
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb70);
  secp256k1_ecmult_const
            ((secp256k1_gej *)rj3.z._40_8_,(secp256k1_ge *)rj3.z.n[4],(secp256k1_scalar *)rj3.z.n[3]
            );
  secp256k1_ge_set_gej_var(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x143fc6);
  if (iVar1 == 0) {
    secp256k1_eckey_pubkey_serialize
              (in_stack_fffffffffffffa48,(uchar *)in_stack_fffffffffffffa40,size_00,0);
    if (hash != (secp256k1_sha256 *)0x41) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x161a,"test condition failed: size == 65");
      abort();
    }
    secp256k1_sha256_write
              ((secp256k1_sha256 *)0x41,(uchar *)in_stack_fffffffffffffa48,
               (size_t)in_stack_fffffffffffffa40);
  }
  else {
    memset(&stack0xfffffffffffffa4f,0,1);
    secp256k1_sha256_write
              (hash,(uchar *)in_stack_fffffffffffffa48,(size_t)in_stack_fffffffffffffa40);
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &zero);
    secp256k1_ecmult(&rj3, &infj, &zero, x);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj4, x, NULL, NULL, 0);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj5, &zero, test_ecmult_accumulate_cb, (void*)x, 1);
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    ge_equals_gej(&r, &rj2);
    ge_equals_gej(&r, &rj3);
    ge_equals_gej(&r, &rj4);
    ge_equals_gej(&r, &rj5);
    ge_equals_gej(&r, &rj6);
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}